

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<bool>::captureExpression<(Catch::Internal::Operator)0,bool>
          (ExpressionLhs<bool> *this,bool *rhs)

{
  bool bVar1;
  OfType OVar2;
  char *pcVar3;
  char *pcVar4;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar1 = this->m_lhs;
  OVar2 = ExpressionFailed;
  if (bVar1 == *rhs) {
    OVar2 = Ok;
  }
  (this->m_result).m_data.resultType = OVar2;
  pcVar4 = "false";
  pcVar3 = "false";
  if (bVar1 != false) {
    pcVar3 = "true";
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,pcVar3,pcVar3 + ((ulong)bVar1 ^ 5));
  std::__cxx11::string::_M_assign((string *)&(this->m_result).m_exprComponents.lhs);
  if ((ulong)*rhs != 0) {
    pcVar4 = "true";
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,pcVar4,pcVar4 + ((ulong)*rhs ^ 5));
  std::__cxx11::string::_M_assign((string *)&(this->m_result).m_exprComponents.rhs);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"==","");
  std::__cxx11::string::_M_assign((string *)&(this->m_result).m_exprComponents.op);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return &this->m_result;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }